

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::ImmutablePatternModifier::applyToMicros
          (ImmutablePatternModifier *this,MicroProps *micros,DecimalQuantity *quantity)

{
  AdoptingModifierStore *pAVar1;
  int8_t iVar2;
  Form FVar3;
  int iVar4;
  undefined4 extraout_var;
  DecimalQuantity copy;
  DecimalQuantity DStack_78;
  
  if (this->rules == (PluralRules *)0x0) {
    pAVar1 = (this->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr;
    iVar2 = DecimalQuantity::signum(quantity);
    micros->modMiddle = pAVar1->mods[(long)iVar2 + 0x10];
  }
  else {
    DecimalQuantity::DecimalQuantity(&DStack_78,quantity);
    DecimalQuantity::roundToInfinity(&DStack_78);
    FVar3 = utils::getStandardPlural(this->rules,&DStack_78.super_IFixedDecimal);
    pAVar1 = (this->pm).super_LocalPointerBase<icu_63::number::impl::AdoptingModifierStore>.ptr;
    iVar2 = DecimalQuantity::signum(quantity);
    iVar4 = (*(pAVar1->super_ModifierStore)._vptr_ModifierStore[2])
                      (pAVar1,(ulong)(uint)(int)iVar2,(ulong)FVar3);
    micros->modMiddle = (Modifier *)CONCAT44(extraout_var,iVar4);
    DecimalQuantity::~DecimalQuantity(&DStack_78);
  }
  return;
}

Assistant:

void ImmutablePatternModifier::applyToMicros(MicroProps& micros, DecimalQuantity& quantity) const {
    if (rules == nullptr) {
        micros.modMiddle = pm->getModifierWithoutPlural(quantity.signum());
    } else {
        // TODO: Fix this. Avoid the copy.
        DecimalQuantity copy(quantity);
        copy.roundToInfinity();
        StandardPlural::Form plural = utils::getStandardPlural(rules, copy);
        micros.modMiddle = pm->getModifier(quantity.signum(), plural);
    }
}